

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_printf.h
# Opt level: O0

char * stbsp__clamp_callback(char *buf,void *user,int len)

{
  char *pcVar1;
  char *local_50;
  char *se;
  char *d;
  char *s;
  stbsp__context *c;
  int len_local;
  void *user_local;
  char *buf_local;
  
  c._4_4_ = len;
  if (*(int *)((long)user + 8) < len) {
    c._4_4_ = *(int *)((long)user + 8);
  }
  if (c._4_4_ != 0) {
    if (buf != *user) {
      se = *user;
      d = buf;
      do {
        pcVar1 = d + 1;
        *se = *d;
        se = se + 1;
        d = pcVar1;
      } while (pcVar1 < buf + c._4_4_);
    }
    *(long *)user = *user + (long)c._4_4_;
    *(int *)((long)user + 8) = *(int *)((long)user + 8) - c._4_4_;
  }
  if (*(int *)((long)user + 8) < 1) {
    buf_local = (char *)0x0;
  }
  else {
    if (*(int *)((long)user + 8) < 0x200) {
      local_50 = (char *)((long)user + 0xc);
    }
    else {
      local_50 = *user;
    }
    buf_local = local_50;
  }
  return buf_local;
}

Assistant:

static char *stbsp__clamp_callback(char *buf, void *user, int len)
{
   stbsp__context *c = (stbsp__context *)user;

   if (len > c->count)
      len = c->count;

   if (len) {
      if (buf != c->buf) {
         char *s, *d, *se;
         d = c->buf;
         s = buf;
         se = buf + len;
         do {
            *d++ = *s++;
         } while (s < se);
      }
      c->buf += len;
      c->count -= len;
   }

   if (c->count <= 0)
      return 0;
   return (c->count >= STB_SPRINTF_MIN) ? c->buf : c->tmp; // go direct into buffer if you can
}